

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall
pbrt::PaddedSobolSampler::SampleDimension
          (PaddedSobolSampler *this,int dimension,uint32_t a,uint32_t hash)

{
  float fVar1;
  
  switch(this->randomizeStrategy) {
  case None:
    fVar1 = SobolSampleFloat<pbrt::NoRandomizer>(a);
    return fVar1;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.h"
             ,0xed,"Unhandled randomization strategy");
  case PermuteDigits:
    fVar1 = SobolSampleFloat<pbrt::BinaryPermuteScrambler>
                      ((ulong)a,dimension,(BinaryPermuteScrambler)hash);
    return fVar1;
  case FastOwen:
    fVar1 = SobolSampleFloat<pbrt::FastOwenScrambler>((ulong)a,dimension,(FastOwenScrambler)hash);
    return fVar1;
  case Owen:
    fVar1 = SobolSampleFloat<pbrt::OwenScrambler>((ulong)a,dimension,(OwenScrambler)hash);
    return fVar1;
  }
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension, uint32_t a, uint32_t hash) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return SobolSample(a, dimension, NoRandomizer());
        case RandomizeStrategy::PermuteDigits:
            return SobolSample(a, dimension, BinaryPermuteScrambler(hash));
        case RandomizeStrategy::FastOwen:
            return SobolSample(a, dimension, FastOwenScrambler(hash));
        case RandomizeStrategy::Owen:
            return SobolSample(a, dimension, OwenScrambler(hash));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }